

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O3

void generateNative<false>(uint32_t nonce)

{
  long lVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  Instruction instr;
  uint64_t hash [8];
  uint8_t blockTemplate [76];
  Program prog;
  uint8_t scratchpad [2097152];
  
  puVar2 = blockTemplate_;
  puVar3 = (undefined8 *)&stack0xffffffffffdff518;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)puVar2;
    puVar2 = puVar2 + 8;
    puVar3 = puVar3 + 1;
  }
  randomx_blake2b(&stack0xffffffffffdff4d8,0x40,&stack0xffffffffffdff518,0x4c,(void *)0x0,0);
  fillAes1Rx4<false>(&stack0xffffffffffdff4d8,0x200000,&stack0xffffffffffdfffe8);
  fillAes4Rx4<false>(&stack0xffffffffffdff4d8,0xa80,&stack0xffffffffffdff568);
  lVar1 = 0x10;
  do {
    randomx::Instruction::print((Instruction *)&stack0xffffffffffdff4d0,(ostream *)&std::cout);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x150);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void generateNative(uint32_t nonce) {
	alignas(16) uint64_t hash[8];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	store32(blockTemplate + 39, nonce);
	blake2b(hash, sizeof(hash), blockTemplate, sizeof(blockTemplate), nullptr, 0);
	uint8_t scratchpad[randomx::ScratchpadSize];
	fillAes1Rx4<softAes>((void*)hash, randomx::ScratchpadSize, scratchpad);
	alignas(16) randomx::Program prog;
	fillAes4Rx4<softAes>((void*)hash, sizeof(prog), &prog);
	std::cout << prog << std::endl;
}